

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lodtalk.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  VMContext *pVVar1;
  string *psVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  string scriptFilename;
  code **local_98;
  undefined8 uStack_90;
  code *local_88;
  code *local_80;
  undefined1 *local_70;
  char *local_68;
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  context = (VMContext *)Lodtalk::createVMContext();
  local_70 = local_60;
  local_68 = (char *)0x0;
  local_60[0] = 0;
  if (1 < argc) {
    uVar5 = 1;
    do {
      __s1 = argv[uVar5];
      iVar4 = strcmp(__s1,"-help");
      if (iVar4 == 0) {
LAB_00102399:
        puts("LodtalkRunner");
        goto LAB_0010247d;
      }
      iVar4 = strcmp(__s1,"-h");
      pcVar3 = local_68;
      if (iVar4 == 0) goto LAB_00102399;
      strlen(__s1);
      std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar3,(ulong)__s1);
      uVar5 = uVar5 + 1;
    } while ((uint)argc != uVar5);
  }
  if (local_68 == (char *)0x0) {
    puts("LodtalkRunner");
    iVar4 = -1;
  }
  else {
    loadKernel();
    iVar4 = std::__cxx11::string::compare((char *)&local_70);
    psVar2 = _stdin;
    pVVar1 = context;
    if (iVar4 == 0) {
      local_98 = &local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"stdin","");
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,".","");
      Lodtalk::VMContext::executeScriptFromFile((_IO_FILE *)pVVar1,psVar2,(string *)&local_98);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98);
      }
    }
    else {
      Lodtalk::VMContext::executeScriptFromFileNamed((string *)context);
    }
    local_98 = (code **)0x0;
    uStack_90 = 0;
    local_80 = std::
               _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/apps/Lodtalk.cpp:62:30)>
               ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/apps/Lodtalk.cpp:62:30)>
               ::_M_manager;
    Lodtalk::VMContext::withInterpreter((function *)context);
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,3);
    }
LAB_0010247d:
    iVar4 = 0;
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return iVar4;
}

Assistant:

int main(int argc, const char *argv[])
{
    context = createVMContext();

    std::string scriptFilename;

    for(int i = 1; i < argc; ++i)
    {
        if(!strcmp(argv[i], "-help") ||
           !strcmp(argv[i], "-h"))
        {
            printHelp();
            return 0;
        }
        else
        {
            scriptFilename = argv[i];
        }
    }

    if(scriptFilename.empty())
    {
        printHelp();
        return -1;
    }

    // Execute the kernel script
    loadKernel();

    // Execute the source script.
    if(scriptFilename == "-")
    {
        // Execute script from the standard input.
        context->executeScriptFromFile(stdin, "stdin");
    }
    else
    {
        // Execute the script from the file.
        context->executeScriptFromFileNamed(scriptFilename);
    }

    // Call the main function.
    context->withInterpreter([&](InterpreterProxy *interpreter) {
        interpreter->pushOop(context->getGlobalContext());
        interpreter->sendMessageWithSelector(context->makeSelector("main"), 0);
        interpreter->popOop();
    });
    return 0;
}